

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsInit(ImGuiTableSettings *settings,ImGuiID id,int columns_count,
                      int columns_count_max)

{
  ImGuiTableSettings *this;
  ImGuiTableColumnSettings *this_00;
  int local_3c;
  int n;
  ImGuiTableColumnSettings *settings_column;
  int columns_count_max_local;
  int columns_count_local;
  ImGuiID id_local;
  ImGuiTableSettings *settings_local;
  
  this = (ImGuiTableSettings *)operator_new(0x10);
  ImGuiTableSettings::ImGuiTableSettings(this);
  ImGuiTableSettings::GetColumnSettings(settings);
  for (local_3c = 0; local_3c < columns_count_max; local_3c = local_3c + 1) {
    this_00 = (ImGuiTableColumnSettings *)operator_new(0xc);
    ImGuiTableColumnSettings::ImGuiTableColumnSettings(this_00);
  }
  settings->ID = id;
  settings->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
  settings->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count_max;
  settings->WantApply = true;
  return;
}

Assistant:

static void TableSettingsInit(ImGuiTableSettings* settings, ImGuiID id, int columns_count, int columns_count_max)
{
    IM_PLACEMENT_NEW(settings) ImGuiTableSettings();
    ImGuiTableColumnSettings* settings_column = settings->GetColumnSettings();
    for (int n = 0; n < columns_count_max; n++, settings_column++)
        IM_PLACEMENT_NEW(settings_column) ImGuiTableColumnSettings();
    settings->ID = id;
    settings->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
    settings->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count_max;
    settings->WantApply = true;
}